

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::set_paging<1>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  bool bVar12;
  
  bVar1 = (this->auxiliary_switches_).main_state_.base.read;
  bVar2 = (this->auxiliary_switches_).main_state_.base.write;
  bVar3 = (this->auxiliary_switches_).main_state_.region_04_08.read;
  bVar4 = (this->auxiliary_switches_).main_state_.region_04_08.write;
  bVar5 = (this->auxiliary_switches_).main_state_.region_20_40.read;
  bVar6 = (this->auxiliary_switches_).main_state_.region_20_40.write;
  puVar8 = this->ram_ + 0x800;
  puVar7 = this->ram_ + 0x200;
  if ((bVar2 & 1U) != 0) {
    puVar8 = this->aux_ram_ + 0x800;
    puVar7 = this->aux_ram_ + 0x200;
  }
  bVar12 = (bVar1 & 1U) != 0;
  puVar10 = this->ram_ + 0x200;
  if (bVar12) {
    puVar10 = this->aux_ram_ + 0x200;
  }
  this->read_pages_[2] = puVar10;
  this->write_pages_[2] = puVar7;
  puVar9 = this->ram_ + 0x800;
  if (bVar12) {
    puVar9 = this->aux_ram_ + 0x800;
  }
  this->read_pages_[3] = puVar10 + 0x100;
  this->write_pages_[3] = puVar7 + 0x100;
  lVar11 = 0;
  do {
    this->read_pages_[lVar11 + 8] = puVar9;
    if (puVar9 != (uint8_t *)0x0) {
      puVar9 = puVar9 + 0x100;
    }
    this->write_pages_[lVar11 + 8] = puVar8;
    if (puVar8 != (uint8_t *)0x0) {
      puVar8 = puVar8 + 0x100;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  puVar7 = this->ram_ + 0x4000;
  if ((bVar1 & 1U) != 0) {
    puVar7 = this->aux_ram_ + 0x4000;
  }
  puVar8 = this->ram_ + 0x4000;
  if ((bVar2 & 1U) != 0) {
    puVar8 = this->aux_ram_ + 0x4000;
  }
  lVar11 = 0;
  do {
    this->read_pages_[lVar11 + 0x40] = puVar7;
    if (puVar7 != (uint8_t *)0x0) {
      puVar7 = puVar7 + 0x100;
    }
    this->write_pages_[lVar11 + 0x40] = puVar8;
    if (puVar8 != (uint8_t *)0x0) {
      puVar8 = puVar8 + 0x100;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x80);
  puVar7 = this->ram_ + 0x400;
  if ((bVar3 & 1U) != 0) {
    puVar7 = this->aux_ram_ + 0x400;
  }
  puVar8 = this->ram_ + 0x400;
  if ((bVar4 & 1U) != 0) {
    puVar8 = this->aux_ram_ + 0x400;
  }
  lVar11 = 0;
  do {
    this->read_pages_[lVar11 + 4] = puVar7;
    if (puVar7 != (uint8_t *)0x0) {
      puVar7 = puVar7 + 0x100;
    }
    this->write_pages_[lVar11 + 4] = puVar8;
    if (puVar8 != (uint8_t *)0x0) {
      puVar8 = puVar8 + 0x100;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  puVar7 = this->ram_ + 0x2000;
  if ((bVar5 & 1U) != 0) {
    puVar7 = this->aux_ram_ + 0x2000;
  }
  puVar8 = this->ram_ + 0x2000;
  if ((bVar6 & 1U) != 0) {
    puVar8 = this->aux_ram_ + 0x2000;
  }
  lVar11 = 0;
  do {
    this->read_pages_[lVar11 + 0x20] = puVar7;
    if (puVar7 != (uint8_t *)0x0) {
      puVar7 = puVar7 + 0x100;
    }
    this->write_pages_[lVar11 + 0x20] = puVar8;
    if (puVar8 != (uint8_t *)0x0) {
      puVar8 = puVar8 + 0x100;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x20);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}